

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionInfoArray __thiscall
Js::ParseableFunctionInfo::GetNestedFuncArray(ParseableFunctionInfo *this)

{
  code *pcVar1;
  bool bVar2;
  NestedArray *pNVar3;
  undefined4 *puVar4;
  ParseableFunctionInfo *this_local;
  
  pNVar3 = GetNestedArray(this);
  if (pNVar3 == (NestedArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x7dc,"(GetNestedArray() != nullptr)","GetNestedArray() != nullptr"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pNVar3 = GetNestedArray(this);
  return (FunctionInfoArray)(pNVar3 + 1);
}

Assistant:

FunctionInfoArray ParseableFunctionInfo::GetNestedFuncArray()
    {
        Assert(GetNestedArray() != nullptr);
        return GetNestedArray()->functionInfoArray;
    }